

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_string_conversion.c
# Opt level: O2

void test_archive_string_conversion(void)

{
  int iVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  archive *paVar4;
  FILE *pFVar5;
  size_t sVar6;
  char *pcVar7;
  archive_string_conv *paVar8;
  archive_string_conv *paVar9;
  archive *paVar10;
  archive_string_conv *paVar11;
  archive *a;
  char *pcVar12;
  wchar_t *pwVar13;
  ulong uVar14;
  uint uVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  wchar_t *wp;
  archive_string_conv *local_8f0;
  archive_string local_8e8;
  archive_string_conv *local_8c8;
  archive_string_conv *local_8c0;
  archive *local_8b8;
  FILE *local_8b0;
  FILE *local_8a8;
  archive *local_8a0;
  char *mp;
  archive_string_conv *local_890;
  char nfd [80];
  char nfc [80];
  size_t local_7e0;
  archive_mstring mstr;
  char utf8_nfc [80];
  archive_entry *ae;
  wchar_t wc_nfc [40];
  char utf16le_nfd [80];
  char utf16le_nfc [80];
  char utf16be_nfd [80];
  char utf16be_nfc [80];
  char utf8_nfd [80];
  wchar_t wc_nfd [40];
  char buff_1 [512];
  char buff [512];
  
  extract_reference_file("test_archive_string_conversion.txt.Z");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̚',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̛',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_filter_all(a)",paVar4)
  ;
  iVar1 = archive_read_support_format_raw(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̜',0,"ARCHIVE_OK",(long)iVar1,"archive_read_support_format_raw(a)",paVar4)
  ;
  wVar2 = archive_read_open_filename(paVar4,"test_archive_string_conversion.txt.Z",0x200);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̞',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, reffile, 512)",paVar4);
  iVar1 = archive_read_next_header(paVar4,&ae);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̠',0,"ARCHIVE_OK",(long)iVar1,"archive_read_next_header(a, &ae)",paVar4);
  pFVar5 = fopen("testdata.txt","w");
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̡',(uint)(pFVar5 != (FILE *)0x0),"(fp = fopen(testdata, \"w\")) != NULL",
                   (void *)0x0);
  while( true ) {
    sVar6 = archive_read_data(paVar4,buff,0x200);
    if ((long)sVar6 < 1) break;
    fwrite(buff,1,sVar6,pFVar5);
  }
  fclose(pFVar5);
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̥',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'č');
    test_skipping(
                 "A test of string normalization for NFC requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8e8.s = (char *)0x0;
    local_8e8.length = 0;
    local_8e8.buffer_length = 0;
    mstr.aes_mbs.s = (char *)0x0;
    mstr.aes_mbs.length = 0;
    mstr.aes_mbs.buffer_length = 0;
    mstr.aes_utf8.s = (char *)0x0;
    mstr.aes_utf8.length = 0;
    mstr.aes_utf8.buffer_length = 0;
    mstr.aes_wcs.s = (wchar_t *)0x0;
    mstr.aes_wcs.length = 0;
    mstr.aes_wcs.buffer_length = 0;
    mstr.aes_mbs_in_locale.s = (char *)0x0;
    mstr.aes_mbs_in_locale.length = 0;
    mstr.aes_mbs_in_locale.buffer_length = 0;
    mstr.aes_set = L'\0';
    mstr._100_4_ = 0;
    paVar4 = archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ę',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    paVar8 = archive_string_conversion_from_charset(paVar4,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ě',(uint)(paVar8 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     paVar4);
    pFVar5 = (FILE *)archive_string_conversion_from_charset(paVar4,"UTF-16BE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ĝ',(uint)(pFVar5 != (FILE *)0x0),
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,paVar4);
    paVar9 = archive_string_conversion_from_charset(paVar4,"UTF-16LE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ğ',(uint)(paVar9 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,paVar4);
    paVar10 = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ġ',(uint)(paVar10 != (archive *)0x0),"(a2 = archive_write_new()) != NULL",
                     (void *)0x0);
    paVar11 = archive_string_conversion_to_charset(paVar10,"UTF-8",L'\0');
    wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'Ģ',(uint)(paVar11 != (archive_string_conv *)0x0),
                             "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))"
                             ,paVar4);
    auVar16._0_4_ = -(uint)((int)((ulong)paVar8 >> 0x20) == 0 && (int)paVar8 == 0);
    auVar16._4_4_ = -(uint)((int)pFVar5 == 0 && (int)((ulong)pFVar5 >> 0x20) == 0);
    auVar16._8_4_ = -(uint)((int)((ulong)paVar9 >> 0x20) == 0 && (int)paVar9 == 0);
    auVar16._12_4_ = -(uint)((int)paVar11 == 0 && (int)((ulong)paVar11 >> 0x20) == 0);
    iVar1 = movmskps(wVar2,auVar16);
    local_8f0 = paVar11;
    if (iVar1 == 0) {
      local_8c8 = paVar8;
      local_8b8 = paVar4;
      local_8a0 = paVar10;
      archive_string_conversion_set_opt(paVar8,L'\x02');
      local_8b0 = pFVar5;
      archive_string_conversion_set_opt((archive_string_conv *)pFVar5,L'\x02');
      local_8c0 = paVar9;
      archive_string_conversion_set_opt(paVar9,L'\x02');
      archive_string_conversion_set_opt(local_8f0,L'\x02');
      local_8a8 = fopen("testdata.txt","r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'į',(uint)(local_8a8 != (FILE *)0x0),
                       "(fp = fopen(testdata, \"r\")) != NULL",(void *)0x0);
      uVar14 = 1;
      while( true ) {
        pcVar7 = fgets(buff_1,0x200,local_8a8);
        if (pcVar7 == (char *)0x0) break;
        if (buff_1[0] != '#') {
          pcVar7 = strchr(buff_1,0x3b);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
            strncpy(nfc,buff_1,0x4f);
            nfc[0x4f] = '\0';
            pcVar12 = strchr(pcVar7 + 1,10);
            if (pcVar12 != (char *)0x0) {
              *pcVar12 = '\0';
              strncpy(nfd,pcVar7 + 1,0x4f);
              nfd[0x4f] = '\0';
              scan_unicode_pattern(utf8_nfc,wc_nfc,utf16be_nfc,utf16le_nfc,nfc,L'\0');
              scan_unicode_pattern(utf8_nfd,wc_nfd,utf16be_nfd,utf16le_nfd,nfd,L'\0');
              sVar6 = strlen(utf8_nfd);
              paVar8 = local_8c8;
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfd,sVar6,local_8c8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ŧ',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",nfd,nfc,uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'Ū',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              sVar6 = strlen(utf8_nfc);
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfc,sVar6,paVar8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ű',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
              failure("NFC(%s) should not be any changed:%d",nfc,uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ų',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              sVar6 = strlen(utf8_nfc);
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfc,sVar6,local_8f0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ź',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfc, t_sconv8)",(void *)0x0);
              failure("NFC(%s) should not be any changed:%d",nfc,uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ż',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16be_nfd,100000,
                                        (archive_string_conv *)local_8b0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ƃ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16be_nfd, 100000, f_sconv16be)",
                                  (void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",nfd,nfc,uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƅ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16le_nfd,100000,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ƌ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16le_nfd, 100000, f_sconv16le)",
                                  (void *)0x0);
              failure("NFD(%s) should be converted to NFC(%s):%d",nfd,nfc,uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'Ǝ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_mstring_copy_mbs_len_l(&mstr,utf8_nfd,100000,local_8c8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ɲ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfd, 100000, f_sconv8)"
                                  ,(void *)0x0);
              paVar4 = local_8b8;
              wVar2 = archive_mstring_get_wcs(local_8b8,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ɵ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",nfd,nfc,uVar14);
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'Ƣ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l
                                (&mstr,utf16be_nfd,100000,(archive_string_conv *)local_8b0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƨ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfd, 100000, f_sconv16be)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs(paVar4,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƪ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",nfd,nfc,uVar14);
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ƭ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l(&mstr,utf16le_nfd,100000,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ƴ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfd, 100000, f_sconv16le)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs(paVar4,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ƶ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              failure("UTF-8 NFD(%s) should be converted to WCS NFC(%s):%d",nfd,nfc,uVar14);
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'Ƹ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_wcs(&mstr,wc_nfc);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ƾ',0,"0",(long)wVar2,"archive_mstring_copy_wcs(&mstr, wc_nfc)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_mbs_l(&mstr,&mp,&local_7e0,local_8f0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ǀ',0,"0",(long)wVar2,
                                  "archive_mstring_get_mbs_l( &mstr, &mp, &mplen, t_sconv8)",
                                  (void *)0x0);
              failure("WCS NFC(%s) should be UTF-8 NFC:%d",nfc,uVar14);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ǃ',utf8_nfc,"utf8_nfc",mp,"mp",(void *)0x0,L'\x01');
            }
          }
        }
        uVar14 = (ulong)((int)uVar14 + 1);
      }
      archive_string_free(&local_8e8);
      archive_mstring_clean(&mstr);
      fclose(local_8a8);
      iVar1 = archive_read_free(local_8b8);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'Ǌ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free(local_8a0);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'ǋ';
    }
    else {
      iVar1 = archive_read_free(paVar4);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'Ħ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  pcVar7 = setlocale(6,"en_US.UTF-8");
  if (pcVar7 == (char *)0x0) {
    skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'Ǡ');
    test_skipping(
                 "A test of string normalization for NFD requires a suitable locale; en_US.UTF-8 not available on this system"
                 );
  }
  else {
    local_8e8.s = (char *)0x0;
    local_8e8.length = 0;
    local_8e8.buffer_length = 0;
    mstr.aes_mbs.s = (char *)0x0;
    mstr.aes_mbs.length = 0;
    mstr.aes_mbs.buffer_length = 0;
    mstr.aes_utf8.s = (char *)0x0;
    mstr.aes_utf8.length = 0;
    mstr.aes_utf8.buffer_length = 0;
    mstr.aes_wcs.s = (wchar_t *)0x0;
    mstr.aes_wcs.length = 0;
    mstr.aes_wcs.buffer_length = 0;
    mstr.aes_mbs_in_locale.s = (char *)0x0;
    mstr.aes_mbs_in_locale.length = 0;
    mstr.aes_mbs_in_locale.buffer_length = 0;
    mstr.aes_set = L'\0';
    mstr._100_4_ = 0;
    pFVar5 = (FILE *)archive_read_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǭ',(uint)(pFVar5 != (FILE *)0x0),"(a = archive_read_new()) != NULL",
                     (void *)0x0);
    paVar8 = archive_string_conversion_from_charset((archive *)pFVar5,"UTF-8",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'Ǯ',(uint)(paVar8 != (archive_string_conv *)0x0),
                     "NULL != (f_sconv8 = archive_string_conversion_from_charset(a, \"UTF-8\", 0))",
                     pFVar5);
    paVar4 = (archive *)archive_string_conversion_from_charset((archive *)pFVar5,"UTF-16BE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǰ',(uint)(paVar4 != (archive *)0x0),
                     "NULL != (f_sconv16be = archive_string_conversion_from_charset(a, \"UTF-16BE\", 0))"
                     ,pFVar5);
    paVar10 = (archive *)archive_string_conversion_from_charset((archive *)pFVar5,"UTF-16LE",L'\0');
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǲ',(uint)(paVar10 != (archive *)0x0),
                     "NULL != (f_sconv16le = archive_string_conversion_from_charset(a, \"UTF-16LE\", 0))"
                     ,pFVar5);
    a = archive_write_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                     ,L'ǳ',(uint)(a != (archive *)0x0),"(a2 = archive_write_new()) != NULL",
                     (void *)0x0);
    paVar9 = archive_string_conversion_to_charset(a,"UTF-8",L'\0');
    wVar2 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                             ,L'ǵ',(uint)(paVar9 != (archive_string_conv *)0x0),
                             "NULL != (t_sconv8 = archive_string_conversion_to_charset(a2, \"UTF-8\", 0))"
                             ,pFVar5);
    auVar17._0_4_ = -(uint)((int)((ulong)paVar8 >> 0x20) == 0 && (int)paVar8 == 0);
    auVar17._4_4_ = -(uint)((int)paVar4 == 0 && (int)((ulong)paVar4 >> 0x20) == 0);
    auVar17._8_4_ = -(uint)((int)((ulong)paVar10 >> 0x20) == 0 && (int)paVar10 == 0);
    auVar17._12_4_ = -(uint)((int)paVar9 == 0 && (int)((ulong)paVar9 >> 0x20) == 0);
    iVar1 = movmskps(wVar2,auVar17);
    if (iVar1 == 0) {
      local_8c0 = paVar8;
      archive_string_conversion_set_opt(paVar8,L'\x04');
      local_8b8 = paVar4;
      archive_string_conversion_set_opt((archive_string_conv *)paVar4,L'\x04');
      local_8a0 = paVar10;
      archive_string_conversion_set_opt((archive_string_conv *)paVar10,L'\x04');
      local_890 = paVar9;
      archive_string_conversion_set_opt(paVar9,L'\x04');
      local_8b0 = fopen("testdata.txt","r");
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                       ,L'Ȃ',(uint)(local_8b0 != (FILE *)0x0),
                       "(fp = fopen(testdata, \"r\")) != NULL",(void *)0x0);
      uVar15 = 1;
      local_8a8 = pFVar5;
      while( true ) {
        pFVar5 = local_8a8;
        pcVar7 = fgets(buff_1,0x200,local_8b0);
        if (pcVar7 == (char *)0x0) break;
        if (buff_1[0] != '#') {
          pcVar7 = strchr(buff_1,0x3b);
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
            strncpy(nfc,buff_1,0x4f);
            nfc[0x4f] = '\0';
            pcVar12 = strchr(pcVar7 + 1,10);
            if (pcVar12 != (char *)0x0) {
              *pcVar12 = '\0';
              strncpy(nfd,pcVar7 + 1,0x4f);
              nfd[0x4f] = '\0';
              wVar2 = scan_unicode_pattern(utf8_nfc,wc_nfc,utf16be_nfc,utf16le_nfc,nfc,L'\x01');
              scan_unicode_pattern(utf8_nfd,wc_nfd,utf16be_nfd,utf16le_nfd,nfd,L'\0');
              sVar6 = strlen(utf8_nfc);
              wVar3 = archive_strncpy_l(&local_8e8,utf8_nfc,sVar6,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ȼ',0,"0",(long)wVar3,
                                  "archive_strcpy_l( &utf8, utf8_nfc, f_sconv8)",(void *)0x0);
              local_8c8 = (archive_string_conv *)CONCAT44(local_8c8._4_4_,wVar2);
              local_8f0 = (archive_string_conv *)CONCAT44(local_8f0._4_4_,uVar15);
              if (wVar2 == L'\0') {
                failure("NFC(%s) should be converted to NFD(%s):%d",nfc,nfd,(ulong)uVar15);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'Ƀ',utf8_nfd,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              else {
                failure("NFC(%s) should not be converted to NFD(%s):%d",nfc,nfd,(ulong)uVar15);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ȿ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              sVar6 = strlen(utf8_nfd);
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfd,sVar6,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'Ɋ',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfd, f_sconv8)",(void *)0x0);
              paVar8 = local_8f0;
              failure("NFD(%s) should not be any changed:%d",nfd,(ulong)local_8f0 & 0xffffffff);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ɍ',utf8_nfd,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              sVar6 = strlen(utf8_nfd);
              wVar2 = archive_strncpy_l(&local_8e8,utf8_nfd,sVar6,local_890);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ɓ',0,"0",(long)wVar2,
                                  "archive_strcpy_l( &utf8, utf8_nfd, t_sconv8)",(void *)0x0);
              failure("NFD(%s) should not be any changed:%d",nfd,(ulong)paVar8 & 0xffffffff);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ɖ',utf8_nfd,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16be_nfc,100000,
                                        (archive_string_conv *)local_8b8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ɜ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16be_nfc, 100000, f_sconv16be)",
                                  (void *)0x0);
              paVar8 = local_8f0;
              if ((int)local_8c8 == 0) {
                failure("NFC(%s) should be converted to NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                wVar2 = L'ɤ';
                pcVar12 = "utf8_nfd";
                pcVar7 = utf8_nfd;
              }
              else {
                failure("NFC(%s) should not be converted to NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                wVar2 = L'ɠ';
                pcVar12 = "utf8_nfc";
                pcVar7 = utf8_nfc;
              }
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,wVar2,pcVar7,pcVar12,local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              wVar2 = archive_strncpy_l(&local_8e8,utf16le_nfc,100000,
                                        (archive_string_conv *)local_8a0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ɫ',0,"0",(long)wVar2,
                                  "archive_strncpy_l( &utf8, utf16le_nfc, 100000, f_sconv16le)",
                                  (void *)0x0);
              pFVar5 = local_8a8;
              if ((int)local_8c8 == 0) {
                failure("NFC(%s) should be converted to NFD(%s):%d",nfc,nfd,
                        (ulong)paVar8 & 0xffffffff);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɳ',utf8_nfd,"utf8_nfd",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              else {
                failure("NFC(%s) should not be converted to NFD(%s):%d",nfc,nfd,
                        (ulong)paVar8 & 0xffffffff);
                assertion_equal_string
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ɯ',utf8_nfc,"utf8_nfc",local_8e8.s,"utf8.s",(void *)0x0,L'\x01');
              }
              wVar2 = archive_mstring_copy_mbs_len_l(&mstr,utf8_nfc,100000,local_8c0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʃ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf8_nfc, 100000, f_sconv8)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs((archive *)pFVar5,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʅ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              if ((int)local_8c8 == 0) {
                failure("UTF-8 NFC(%s) should be converted to WCS NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                wVar2 = L'ʍ';
                pwVar13 = wc_nfd;
                pcVar7 = "wc_nfd";
              }
              else {
                failure("UTF-8 NFC(%s) should not be converted to WCS NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                wVar2 = L'ʉ';
                pwVar13 = wc_nfc;
                pcVar7 = "wc_nfc";
              }
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,wVar2,pwVar13,pcVar7,wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l
                                (&mstr,utf16be_nfc,100000,(archive_string_conv *)local_8b8);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʔ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16be_nfc, 100000, f_sconv16be)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs((archive *)pFVar5,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʖ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              if ((int)local_8c8 == 0) {
                failure("UTF-16BE NFC(%s) should be converted to WCS NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                wVar2 = L'ʟ';
                pwVar13 = wc_nfd;
                pcVar7 = "wc_nfd";
              }
              else {
                failure("UTF-16BE NFC(%s) should not be converted to WCS NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                wVar2 = L'ʛ';
                pwVar13 = wc_nfc;
                pcVar7 = "wc_nfc";
              }
              assertion_equal_wstring
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,wVar2,pwVar13,pcVar7,wp,"wp",(void *)0x0);
              wVar2 = archive_mstring_copy_mbs_len_l
                                (&mstr,utf16le_nfc,100000,(archive_string_conv *)local_8a0);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʦ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_mbs_len_l( &mstr, utf16le_nfc, 100000, f_sconv16le)"
                                  ,(void *)0x0);
              wVar2 = archive_mstring_get_wcs((archive *)pFVar5,&mstr,&wp);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʨ',0,"0",(long)wVar2,"archive_mstring_get_wcs(a, &mstr, &wp)",
                                  (void *)0x0);
              paVar8 = local_8f0;
              uVar15 = (uint)local_8f0;
              if ((int)local_8c8 == 0) {
                failure("UTF-16LE NFC(%s) should be converted to WCS NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ʱ',wc_nfd,"wc_nfd",wp,"wp",(void *)0x0);
              }
              else {
                failure("UTF-16LE NFC(%s) should not be converted to WCS NFD(%s):%d",nfc,nfd,
                        (ulong)local_8f0 & 0xffffffff);
                assertion_equal_wstring
                          ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                           ,L'ʭ',wc_nfc,"wc_nfc",wp,"wp",(void *)0x0);
              }
              wVar2 = archive_mstring_copy_wcs(&mstr,wc_nfd);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʸ',0,"0",(long)wVar2,
                                  "archive_mstring_copy_wcs( &mstr, wc_nfd)",(void *)0x0);
              wVar2 = archive_mstring_get_mbs_l(&mstr,&mp,&local_7e0,local_890);
              assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                                  ,L'ʺ',0,"0",(long)wVar2,
                                  "archive_mstring_get_mbs_l( &mstr, &mp, &mplen, t_sconv8)",
                                  (void *)0x0);
              failure("WCS NFD(%s) should be UTF-8 NFD:%d",nfd,(ulong)paVar8 & 0xffffffff);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                         ,L'ʽ',utf8_nfd,"utf8_nfd",mp,"mp",(void *)0x0,L'\x01');
            }
          }
        }
        uVar15 = uVar15 + 1;
      }
      archive_string_free(&local_8e8);
      archive_mstring_clean(&mstr);
      fclose(local_8b0);
      iVar1 = archive_read_free((archive *)pFVar5);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                          ,L'˄',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
      iVar1 = archive_write_free(a);
      pcVar7 = "archive_write_free(a2)";
      wVar2 = L'˅';
    }
    else {
      iVar1 = archive_read_free((archive *)pFVar5);
      pcVar7 = "archive_read_free(a)";
      wVar2 = L'ǹ';
    }
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                        ,wVar2,0,"ARCHIVE_OK",(long)iVar1,pcVar7,(void *)0x0);
  }
  setlocale(6,"en_US.UTF-8");
  paVar4 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'ː',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF-8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˓',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-8\", 1))",paVar4)
  ;
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˖',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˙',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˜',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"utf8",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˟',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf8\", 1))",paVar4);
  failure("Charset name should be UTF-8");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˢ',"UTF-8","\"UTF-8\"",pcVar7,"archive_string_conversion_charset_name(sconv)",
             (void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF-16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˥',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˨',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF16BE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˫',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16BE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'ˮ',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"utf16be",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˱',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16be\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16BE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˴',"UTF-16BE","\"UTF-16BE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF-16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˷',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF-16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'˺',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"UTF16LE",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'˽',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"UTF16LE\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̀',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  paVar8 = archive_string_conversion_to_charset(paVar4,"utf16le",L'\x01');
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                   ,L'̃',(uint)(paVar8 != (archive_string_conv *)0x0),
                   "NULL != (sconv = archive_string_conversion_to_charset(a, \"utf16le\", 1))",
                   paVar4);
  failure("Charset name should be UTF-16LE");
  pcVar7 = archive_string_conversion_charset_name(paVar8);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
             ,L'̆',"UTF-16LE","\"UTF-16LE\"",pcVar7,"archive_string_conversion_charset_name(sconv)"
             ,(void *)0x0,L'\0');
  iVar1 = archive_read_free(paVar4);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_string_conversion.c"
                      ,L'̈',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_archive_string_conversion)
{
	static const char reffile[] = "test_archive_string_conversion.txt.Z";
	static const char testdata[] = "testdata.txt";
	struct archive *a;
	struct archive_entry *ae;
	char buff[512];
	ssize_t size;
	FILE *fp;

	/*
	 * Extract a test pattern file.
	 */
	extract_reference_file(reffile);
	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_filter_all(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_raw(a));
        assertEqualIntA(a, ARCHIVE_OK,
            archive_read_open_filename(a, reffile, 512));

	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header(a, &ae));
	assert((fp = fopen(testdata, "w")) != NULL);
	while ((size = archive_read_data(a, buff, 512)) > 0)
		fwrite(buff, 1, size, fp);
	fclose(fp);
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	test_archive_string_normalization_nfc(testdata);
	test_archive_string_normalization_mac_nfd(testdata);
	test_archive_string_canonicalization();
}